

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O1

void anon_unknown.dwarf_20cafe::InitPanning(ALCdevice *device,bool hqdec,bool stablize)

{
  float *pfVar1;
  DevFmtChannels DVar2;
  char *pcVar3;
  BFormatDec *__ptr;
  undefined8 uVar4;
  bool bVar5;
  ALuint o_1;
  uint uVar6;
  ulong uVar7;
  array<unsigned_char,_16UL> *paVar8;
  pointer paVar9;
  ALuint o;
  array<float,_16UL> *paVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  BFormatDec *ptr;
  array<float,_16UL> *paVar15;
  long lVar16;
  size_t main_chans;
  ulong uVar17;
  long lVar18;
  _GLOBAL__N_1 *this;
  BFChannelConfig BVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  pointer main_chans_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffs;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffslf;
  vector<ChannelDec> chancoeffslf;
  vector<ChannelDec> chancoeffs;
  undefined1 local_f8 [16];
  pointer local_e8;
  undefined1 local_d8 [16];
  pointer local_c8;
  long local_b8;
  undefined4 local_ac;
  ulong local_a8;
  long local_a0;
  value_type local_98;
  char *local_50;
  ulong local_48;
  long local_40;
  ALCdevice *local_38;
  
  DVar2 = device->FmtChans;
  uVar7 = (ulong)DVar2;
  if (uVar7 < 8) {
    lVar16 = *(long *)(&DAT_001b1110 + (uint)DVar2 * 8);
    local_50 = &DAT_00192110 + *(int *)(&DAT_00192110 + uVar7 * 4);
    local_a8 = (ulong)*(uint *)(&DAT_00192778 + uVar7 * 4);
    lVar12 = *(long *)(&DAT_001b1150 + (uint)DVar2 * 8);
    lVar20 = *(long *)(&DAT_001b1190 + (uint)DVar2 * 8);
    lVar22 = *(long *)(&DAT_001b11d0 + uVar7 * 8);
    lVar21 = *(long *)(&DAT_001b1210 + uVar7 * 8);
    local_b8 = *(long *)(&DAT_001b1250 + (uint)DVar2 * 8);
  }
  else {
    lVar16 = 0;
    local_50 = "first";
    local_a8 = 0;
    lVar12 = 0;
    lVar20 = 0;
    lVar22 = 0;
    lVar21 = 0;
    local_b8 = 0;
  }
  if (DVar2 == DevFmtAmbi3D) {
    pcVar3 = (device->DeviceName)._M_dataplus._M_p;
    paVar8 = &AmbiIndex::FromFuMa;
    if (device->mAmbiLayout != FuMa) {
      paVar8 = &AmbiIndex::FromACN;
    }
    paVar15 = &AmbiScale::FromN3D;
    if (device->mAmbiScale == Default) {
      paVar15 = &AmbiScale::FromSN3D;
    }
    paVar10 = &AmbiScale::FromFuMa;
    if (device->mAmbiScale != FuMa) {
      paVar10 = paVar15;
    }
    lVar16 = (ulong)device->mAmbiOrder + 1;
    main_chans = lVar16 * lVar16;
    if (main_chans != 0) {
      lVar16 = 0;
      do {
        BVar19.Index._0_1_ = paVar8->_M_elems[lVar16];
        BVar19.Scale = 1.0 / paVar10->_M_elems[paVar8->_M_elems[lVar16]];
        BVar19.Index._1_3_ = 0;
        (device->Dry).AmbiMap._M_elems[lVar16] = BVar19;
        lVar16 = lVar16 + 1;
      } while (main_chans - lVar16 != 0);
    }
    AllocChannels(device,main_chans,0);
    ConfigValueFloat((char *)&local_98,pcVar3,"decoder");
    if (local_98._M_elems[0]._0_1_ == (default_delete<BFormatDec>)0x0) {
      local_98._M_elems[1] = 0.0;
    }
    else {
    }
    if (local_98._M_elems[1] <= 0.0) {
      return;
    }
    InitNearFieldCtrl(device,local_98._M_elems[1] * 343.3,device->mAmbiOrder,true);
    return;
  }
  local_ac = (undefined4)CONCAT71(in_register_00000011,stablize);
  bVar5 = lVar20 != lVar12 && hqdec;
  local_f8 = ZEXT816(0);
  local_c8 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_d8 = local_f8;
  if (lVar16 - local_b8 != 0) {
    local_40 = lVar16 - local_b8 >> 2;
    uVar7 = (ulong)((int)local_a8 + 1);
    local_40 = local_40 + (ulong)(local_40 == 0);
    lVar12 = 0;
    local_38 = device;
    do {
      this = (_GLOBAL__N_1 *)(ulong)*(uint *)(local_b8 + lVar12 * 4);
      uVar14 = (ulong)(local_38->RealOut).ChannelIndex._M_elems[(long)this];
      if (uVar14 == 0xffffffff) {
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::InitPanning(this);
        }
      }
      else {
        uVar17 = (long)(local_d8._8_8_ - local_d8._0_8_) >> 6;
        local_48 = uVar14 + 1;
        if (uVar17 <= local_48) {
          uVar17 = local_48;
        }
        local_98._M_elems[0xc] = 0.0;
        local_98._M_elems[0xd] = 0.0;
        local_98._M_elems[0xe] = 0.0;
        local_98._M_elems[0xf] = 0.0;
        local_98._M_elems[8] = 0.0;
        local_98._M_elems[9] = 0.0;
        local_98._M_elems[10] = 0.0;
        local_98._M_elems[0xb] = 0.0;
        local_98._M_elems[4] = 0.0;
        local_98._M_elems[5] = 0.0;
        local_98._M_elems[6] = 0.0;
        local_98._M_elems[7] = 0.0;
        local_98._M_elems._0_8_ = (BFormatDec *)0x0;
        local_98._M_elems[2] = 0.0;
        local_98._M_elems[3] = 0.0;
        local_a0 = lVar12;
        std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                  ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
                   local_d8,uVar17,&local_98);
        uVar17 = 0;
        lVar12 = 0;
        do {
          lVar18 = 2 - (ulong)(uVar17 == 0);
          do {
            ((pointer)(local_d8._0_8_ + uVar14 * 0x40))->_M_elems[lVar12] =
                 *(float *)(lVar21 + lVar12 * 4) * *(float *)(lVar16 + uVar17 * 4);
            lVar12 = lVar12 + 1;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar7);
        lVar12 = local_a0;
        if (bVar5) {
          uVar17 = (long)(local_f8._8_8_ - local_f8._0_8_) >> 6;
          if (uVar17 <= local_48) {
            uVar17 = local_48;
          }
          local_98._M_elems[0xc] = 0.0;
          local_98._M_elems[0xd] = 0.0;
          local_98._M_elems[0xe] = 0.0;
          local_98._M_elems[0xf] = 0.0;
          local_98._M_elems[8] = 0.0;
          local_98._M_elems[9] = 0.0;
          local_98._M_elems[10] = 0.0;
          local_98._M_elems[0xb] = 0.0;
          local_98._M_elems[4] = 0.0;
          local_98._M_elems[5] = 0.0;
          local_98._M_elems[6] = 0.0;
          local_98._M_elems[7] = 0.0;
          local_98._M_elems._0_8_ = (BFormatDec *)0x0;
          local_98._M_elems[2] = 0.0;
          local_98._M_elems[3] = 0.0;
          std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                    ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                      *)local_f8,uVar17,&local_98);
          uVar17 = 0;
          lVar18 = 0;
          do {
            lVar12 = 2 - (ulong)(uVar17 == 0);
            do {
              ((pointer)(local_f8._0_8_ + uVar14 * 0x40))->_M_elems[lVar18] =
                   *(float *)(lVar20 + lVar18 * 4) * *(float *)(lVar22 + uVar17 * 4);
              lVar18 = lVar18 + 1;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar17 = uVar17 + 1;
            lVar12 = local_a0;
          } while (uVar17 != uVar7);
        }
      }
      lVar12 = lVar12 + 1;
      lVar21 = lVar21 + 0x1c;
      lVar20 = lVar20 + 0x1c;
      device = local_38;
    } while (lVar12 != local_40);
  }
  device->mAmbiOrder = (ALuint)local_a8;
  main_chans_00 = (pointer)(ulong)((ALuint)local_a8 * 2 + 1);
  paVar9 = (pointer)0x0;
  do {
    (device->Dry).AmbiMap._M_elems[(long)paVar9] =
         (BFChannelConfig)
         ((ulong)*(byte *)((long)paVar9[0x6452]._M_elems + 0xf) << 0x20 | 0x3f800000);
    paVar9 = (pointer)((long)paVar9->_M_elems + 1);
  } while (main_chans_00 != paVar9);
  uVar6 = ChannelsFromDevFmt(device->FmtChans,device->mAmbiOrder);
  AllocChannels(device,(size_t)main_chans_00,(ulong)uVar6);
  pcVar3 = local_50;
  if ((char)local_ac != '\0') {
    uVar7 = (ulong)(device->RealOut).ChannelIndex._M_elems[2];
    if (uVar7 < (ulong)((long)(local_d8._8_8_ - local_d8._0_8_) >> 6)) {
      lVar16 = 0;
      auVar24 = (undefined1  [16])0x0;
      do {
        pfVar1 = ((pointer)(local_d8._0_8_ + uVar7 * 0x40))->_M_elems + lVar16;
        auVar26._4_4_ = -(uint)(pfVar1[1] != 0.0);
        auVar26._0_4_ = -(uint)(*pfVar1 != 0.0);
        auVar26._8_4_ = -(uint)(pfVar1[2] != 0.0);
        auVar26._12_4_ = -(uint)(pfVar1[3] != 0.0);
        auVar26 = packssdw(auVar26,auVar26);
        auVar26 = packsswb(auVar26,auVar26);
        auVar24 = auVar24 | auVar26 & _DAT_001912a0;
        lVar16 = lVar16 + 4;
      } while (lVar16 != 0x10);
      auVar23._0_4_ = auVar24._0_4_ >> 0x10;
      auVar23._4_4_ = 0;
      auVar23._8_4_ = auVar24._8_4_ >> 0x10;
      auVar23._12_4_ = auVar24._12_4_ >> 0x10;
      uVar11 = (uint)(ushort)(SUB162(auVar23 | auVar24,0) >> 8) | SUB164(auVar23 | auVar24,0);
    }
    else {
      uVar11 = 0;
    }
    if ((uVar11 & 1) == 0) {
      if (uVar7 < (ulong)((long)(local_f8._8_8_ - local_f8._0_8_) >> 6)) {
        auVar24 = ZEXT416(uVar11 & 0xff);
        lVar16 = 0;
        do {
          pfVar1 = ((pointer)(local_f8._0_8_ + uVar7 * 0x40))->_M_elems + lVar16;
          auVar27._4_4_ = -(uint)(pfVar1[1] != 0.0);
          auVar27._0_4_ = -(uint)(*pfVar1 != 0.0);
          auVar27._8_4_ = -(uint)(pfVar1[2] != 0.0);
          auVar27._12_4_ = -(uint)(pfVar1[3] != 0.0);
          auVar26 = packssdw(auVar27,auVar27);
          auVar26 = packsswb(auVar26,auVar26);
          auVar24 = auVar24 | auVar26 & _DAT_001912a0;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x10);
        auVar25._0_4_ = auVar24._0_4_ >> 0x10;
        auVar25._4_4_ = 0;
        auVar25._8_4_ = auVar24._8_4_ >> 0x10;
        auVar25._12_4_ = auVar24._12_4_ >> 0x10;
        uVar11 = (uint)(ushort)(SUB162(auVar25 | auVar24,0) >> 8) | SUB164(auVar25 | auVar24,0);
      }
    }
    if ((uVar11 & 1) == 0) {
      uVar6 = ChannelsFromDevFmt(device->FmtChans,device->mAmbiOrder);
      CreateStablizer((size_t)&local_98,uVar6);
      ptr = (BFormatDec *)local_98._M_elems._0_8_;
      if (2 < (int)gLogLevel) {
        _GLOBAL__N_1::InitPanning();
      }
      goto LAB_0015b475;
    }
  }
  ptr = (BFormatDec *)0x0;
LAB_0015b475:
  if (2 < (int)gLogLevel) {
    pcVar13 = "single";
    if (bVar5) {
      pcVar13 = "dual";
    }
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Enabling %s-band %s-order%s ambisonic decoder\n",pcVar13
            ,pcVar3,0x1937b3);
  }
  coeffs.mDataEnd = (pointer)local_d8._0_8_;
  coeffs.mData = main_chans_00;
  coeffslf.mDataEnd = (pointer)local_f8._0_8_;
  coeffslf.mData = (pointer)local_d8._8_8_;
  BFormatDec::Create((size_t)&local_98,coeffs,coeffslf,
                     (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                     local_f8._8_8_);
  uVar4 = local_98._M_elems._0_8_;
  local_98._M_elems._0_8_ = (BFormatDec *)0x0;
  __ptr = (device->AmbiDecoder)._M_t.
          super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
          super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
          super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
  (device->AmbiDecoder)._M_t.super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>.
  _M_t.super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
  super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl = (BFormatDec *)uVar4;
  if (__ptr != (BFormatDec *)0x0) {
    std::default_delete<BFormatDec>::operator()
              ((default_delete<BFormatDec> *)&device->AmbiDecoder,__ptr);
  }
  if ((BFormatDec *)local_98._M_elems._0_8_ != (BFormatDec *)0x0) {
    std::default_delete<BFormatDec>::operator()
              ((default_delete<BFormatDec> *)&local_98,(BFormatDec *)local_98._M_elems._0_8_);
  }
  local_98._M_elems[0] = 0.0;
  local_98._M_elems[1] = 0.0;
  if (ptr != (BFormatDec *)0x0) {
    al_free(ptr);
  }
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    al_free((void *)local_f8._0_8_);
  }
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    al_free((void *)local_d8._0_8_);
  }
  return;
}

Assistant:

void InitPanning(ALCdevice *device, const bool hqdec=false, const bool stablize=false)
{
    DecoderView decoder{};
    switch(device->FmtChans)
    {
    case DevFmtMono:
        decoder = MonoConfig;
        break;
    case DevFmtStereo:
        decoder = StereoConfig;
        break;
    case DevFmtQuad:
        decoder = QuadConfig;
        break;
    case DevFmtX51:
        decoder = X51Config;
        break;
    case DevFmtX51Rear:
        decoder = X51RearConfig;
        break;
    case DevFmtX61:
        decoder = X61Config;
        break;
    case DevFmtX71:
        decoder = X71Config;
        break;
    case DevFmtAmbi3D:
        break;
    }

    if(device->FmtChans == DevFmtAmbi3D)
    {
        const char *devname{device->DeviceName.c_str()};
        const std::array<uint8_t,MAX_AMBI_CHANNELS> &acnmap = GetAmbiLayout(device->mAmbiLayout);
        const std::array<float,MAX_AMBI_CHANNELS> &n3dscale = GetAmbiScales(device->mAmbiScale);

        /* For DevFmtAmbi3D, the ambisonic order is already set. */
        const size_t count{AmbiChannelsFromOrder(device->mAmbiOrder)};
        std::transform(acnmap.begin(), acnmap.begin()+count, std::begin(device->Dry.AmbiMap),
            [&n3dscale](const uint8_t &acn) noexcept -> BFChannelConfig
            { return BFChannelConfig{1.0f/n3dscale[acn], acn}; }
        );
        AllocChannels(device, count, 0);

        float nfc_delay{ConfigValueFloat(devname, "decoder", "nfc-ref-delay").value_or(0.0f)};
        if(nfc_delay > 0.0f)
            InitNearFieldCtrl(device, nfc_delay * SpeedOfSoundMetersPerSec, device->mAmbiOrder,
                true);
    }
    else
    {
        const bool dual_band{hqdec && !decoder.mCoeffsLF.empty()};
        al::vector<ChannelDec> chancoeffs, chancoeffslf;
        for(size_t i{0u};i < decoder.mChannels.size();++i)
        {
            const ALuint idx{GetChannelIdxByName(device->RealOut, decoder.mChannels[i])};
            if(idx == INVALID_CHANNEL_INDEX)
            {
                ERR("Failed to find %s channel in device\n",
                    GetLabelFromChannel(decoder.mChannels[i]));
                continue;
            }

            chancoeffs.resize(maxz(chancoeffs.size(), idx+1u), ChannelDec{});
            al::span<float,MAX_AMBI_CHANNELS> coeffs{chancoeffs[idx]};
            size_t start{0};
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffs[i][start] * decoder.mOrderGain[o];
                    ++start;
                } while(--count);
            }
            if(!dual_band)
                continue;

            chancoeffslf.resize(maxz(chancoeffslf.size(), idx+1u), ChannelDec{});
            coeffs = chancoeffslf[idx];
            start = 0;
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffsLF[i][start] * decoder.mOrderGainLF[o];
                    ++start;
                } while(--count);
            }
        }

        /* For non-DevFmtAmbi3D, set the ambisonic order. */
        device->mAmbiOrder = decoder.mOrder;

        /* Built-in speaker decoders are always 2D. */
        const size_t ambicount{Ambi2DChannelsFromOrder(decoder.mOrder)};
        std::transform(AmbiIndex::From2D.begin(), AmbiIndex::From2D.begin()+ambicount,
            std::begin(device->Dry.AmbiMap),
            [](const uint8_t &index) noexcept { return BFChannelConfig{1.0f, index}; }
        );
        AllocChannels(device, ambicount, device->channelsFromFmt());

        std::unique_ptr<FrontStablizer> stablizer;
        if(stablize)
        {
            /* Only enable the stablizer if the decoder does not output to the
             * front-center channel.
             */
            const auto cidx = device->RealOut.ChannelIndex[FrontCenter];
            bool hasfc{false};
            if(cidx < chancoeffs.size())
            {
                for(const auto &coeff : chancoeffs[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc && cidx < chancoeffslf.size())
            {
                for(const auto &coeff : chancoeffslf[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc)
            {
                stablizer = CreateStablizer(device->channelsFromFmt(), device->Frequency);
                TRACE("Front stablizer enabled\n");
            }
        }

        TRACE("Enabling %s-band %s-order%s ambisonic decoder\n",
            !dual_band ? "single" : "dual",
            (decoder.mOrder > 2) ? "third" :
            (decoder.mOrder > 1) ? "second" : "first",
            "");
        device->AmbiDecoder = BFormatDec::Create(ambicount, chancoeffs, chancoeffslf,
            std::move(stablizer));
    }
}